

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParseNameClass
          (xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr pxVar1;
  int iVar2;
  xmlRelaxNGDefinePtr_conflict def_00;
  xmlChar *pxVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlRelaxNGDefinePtr pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  char *pcVar8;
  xmlNs *pxVar9;
  xmlChar *str1;
  xmlChar *str2;
  _xmlNode *node_00;
  
  if (node->ns == (xmlNs *)0x0) goto LAB_001864f5;
  def_00 = def;
  if (node->type == XML_ELEMENT_NODE) {
    iVar2 = xmlStrEqual(node->name,"name");
    pxVar9 = node->ns;
    if (iVar2 == 0) {
LAB_001860dd:
      if (pxVar9 == (xmlNs *)0x0) goto LAB_001864f5;
      if (node->type == XML_ELEMENT_NODE) {
        iVar2 = xmlStrEqual(node->name,(xmlChar *)"anyName");
        pxVar9 = node->ns;
        if (iVar2 != 0) {
          iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar2 != 0) goto LAB_0018608e;
          pxVar9 = node->ns;
        }
        if (pxVar9 == (xmlNs *)0x0) goto LAB_001864f5;
        if (((node->type == XML_ELEMENT_NODE) &&
            (iVar2 = xmlStrEqual(node->name,(xmlChar *)"nsName"), iVar2 != 0)) &&
           (iVar2 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
           iVar2 != 0)) goto LAB_0018608e;
      }
    }
    else {
      iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
      if (iVar2 == 0) {
        pxVar9 = node->ns;
        goto LAB_001860dd;
      }
LAB_0018608e:
      if ((def->type != XML_RELAXNG_ELEMENT) && (def->type != XML_RELAXNG_ATTRIBUTE)) {
        def_00 = xmlRelaxNGNewDefine(ctxt,node);
        if (def_00 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        def_00->parent = def;
        def_00->type = (ctxt->flags & 1U) * 5 + XML_RELAXNG_ELEMENT;
      }
    }
  }
  if ((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) goto LAB_001864f5;
  iVar2 = xmlStrEqual(node->name,"name");
  pxVar9 = node->ns;
  if (iVar2 == 0) {
LAB_00186203:
    if ((pxVar9 == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) goto LAB_001864f5;
    iVar2 = xmlStrEqual(node->name,(xmlChar *)"anyName");
    pxVar9 = node->ns;
    if (iVar2 != 0) {
      iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
      if (iVar2 == 0) {
        pxVar9 = node->ns;
        goto LAB_0018636d;
      }
      def_00->name = (xmlChar *)0x0;
      def_00->ns = (xmlChar *)0x0;
LAB_00186254:
      if (node->children != (xmlNodePtr)0x0) {
        pxVar4 = xmlRelaxNGParseExceptNameClass
                           (ctxt,node->children,(uint)(def->type == XML_RELAXNG_ATTRIBUTE));
        def_00->nameClass = pxVar4;
      }
      goto LAB_00186339;
    }
LAB_0018636d:
    if ((pxVar9 == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) goto LAB_001864f5;
    iVar2 = xmlStrEqual(node->name,(xmlChar *)"nsName");
    pxVar9 = node->ns;
    if (iVar2 != 0) {
      iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
      if (iVar2 != 0) {
        def_00->name = (xmlChar *)0x0;
        pxVar3 = xmlGetProp(node,"ns");
        def_00->ns = pxVar3;
        if (pxVar3 == (xmlChar *)0x0) {
          xmlRngPErr(ctxt,node,0x421,"nsName has no ns attribute\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        if ((((ctxt->flags & 1) != 0) && (def_00->ns != (xmlChar *)0x0)) &&
           (iVar2 = xmlStrEqual(def_00->ns,(xmlChar *)"http://www.w3.org/2000/xmlns"), iVar2 != 0))
        {
          xmlRngPErr(ctxt,node,0x462,"Attribute with namespace \'%s\' is not allowed\n",def_00->ns,
                     (xmlChar *)0x0);
        }
        goto LAB_00186254;
      }
      pxVar9 = node->ns;
    }
    if (((pxVar9 == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
       ((iVar2 = xmlStrEqual(node->name,(xmlChar *)"choice"), iVar2 == 0 ||
        (iVar2 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
        iVar2 == 0)))) {
LAB_001864f5:
      xmlRngPErr(ctxt,node,0x3ee,"expecting name, anyName, nsName or choice : got %s\n",node->name,
                 (xmlChar *)0x0);
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    def_00 = def;
    if (def->type != XML_RELAXNG_CHOICE) {
      def_00 = xmlRelaxNGNewDefine(ctxt,node);
      if (def_00 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      def_00->parent = def;
      def_00->type = XML_RELAXNG_CHOICE;
    }
    node_00 = node->children;
    if (node_00 != (_xmlNode *)0x0) {
      pxVar4 = (xmlRelaxNGDefinePtr_conflict)0x0;
      do {
        pxVar6 = xmlRelaxNGParseNameClass(ctxt,node_00,def_00);
        pxVar7 = pxVar4;
        if (((pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
            (pxVar7 = pxVar6, pxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0)) &&
           (pxVar7 = pxVar4, pxVar6 != def_00)) {
          pxVar4->next = pxVar6;
          pxVar7 = pxVar6;
        }
        node_00 = node_00->next;
        pxVar4 = pxVar7;
      } while (node_00 != (_xmlNode *)0x0);
      goto LAB_00186339;
    }
    pcVar8 = "Element choice is empty\n";
    iVar2 = 0x3ef;
    pxVar3 = (xmlChar *)0x0;
  }
  else {
    iVar2 = xmlStrEqual(pxVar9->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
    if (iVar2 == 0) {
      pxVar9 = node->ns;
      goto LAB_00186203;
    }
    pxVar3 = xmlNodeGetContent(node);
    xmlRelaxNGNormExtSpace(pxVar3);
    iVar2 = xmlValidateNCName(pxVar3,0);
    if (iVar2 != 0) {
      if (node->parent == (_xmlNode *)0x0) {
        pcVar8 = "name \'%s\' is not an NCName\n";
        str2 = (xmlChar *)0x0;
        str1 = pxVar3;
      }
      else {
        pcVar8 = "Element %s name \'%s\' is not an NCName\n";
        str1 = node->parent->name;
        str2 = pxVar3;
      }
      xmlRngPErr(ctxt,node,0x3fb,pcVar8,str1,str2);
    }
    def_00->name = pxVar3;
    pxVar3 = xmlGetProp(node,"ns");
    def_00->ns = pxVar3;
    if (((pxVar3 != (xmlChar *)0x0 & (byte)ctxt->flags) == 1) &&
       (iVar2 = xmlStrEqual(pxVar3,(xmlChar *)"http://www.w3.org/2000/xmlns"), iVar2 != 0)) {
      xmlRngPErr(ctxt,node,0x462,"Attribute with namespace \'%s\' is not allowed\n",pxVar3,
                 (xmlChar *)0x0);
    }
    if ((((pxVar3 != (xmlChar *)0x0 & (byte)ctxt->flags) != 1) || (*pxVar3 != '\0')) ||
       (iVar2 = xmlStrEqual(def_00->name,"xmlns"), iVar2 == 0)) goto LAB_00186339;
    pcVar8 = "Attribute with QName \'xmlns\' is not allowed\n";
    iVar2 = 0x461;
  }
  xmlRngPErr(ctxt,node,iVar2,pcVar8,pxVar3,(xmlChar *)0x0);
LAB_00186339:
  if (def_00 == def) {
    return def_00;
  }
  pxVar1 = def->nameClass;
  if (def->nameClass != (xmlRelaxNGDefinePtr)0x0) {
    do {
      pxVar5 = pxVar1;
      pxVar1 = pxVar5->next;
    } while (pxVar1 != (xmlRelaxNGDefinePtr)0x0);
    pxVar5->next = def_00;
    return def_00;
  }
  def->nameClass = def_00;
  return def_00;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseNameClass(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node,
                         xmlRelaxNGDefinePtr def)
{
    xmlRelaxNGDefinePtr ret, tmp;
    xmlChar *val;

    ret = def;
    if ((IS_RELAXNG(node, "name")) || (IS_RELAXNG(node, "anyName")) ||
        (IS_RELAXNG(node, "nsName"))) {
        if ((def->type != XML_RELAXNG_ELEMENT) &&
            (def->type != XML_RELAXNG_ATTRIBUTE)) {
            ret = xmlRelaxNGNewDefine(ctxt, node);
            if (ret == NULL)
                return (NULL);
            ret->parent = def;
            if (ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE)
                ret->type = XML_RELAXNG_ATTRIBUTE;
            else
                ret->type = XML_RELAXNG_ELEMENT;
        }
    }
    if (IS_RELAXNG(node, "name")) {
        val = xmlNodeGetContent(node);
        xmlRelaxNGNormExtSpace(val);
        if (xmlValidateNCName(val, 0)) {
	    if (node->parent != NULL)
		xmlRngPErr(ctxt, node, XML_RNGP_ELEMENT_NAME,
			   "Element %s name '%s' is not an NCName\n",
			   node->parent->name, val);
	    else
		xmlRngPErr(ctxt, node, XML_RNGP_ELEMENT_NAME,
			   "name '%s' is not an NCName\n",
			   val, NULL);
        }
        ret->name = val;
        val = xmlGetProp(node, BAD_CAST "ns");
        ret->ns = val;
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (val != NULL) &&
            (xmlStrEqual(val, BAD_CAST "http://www.w3.org/2000/xmlns"))) {
	    xmlRngPErr(ctxt, node, XML_RNGP_XML_NS,
                        "Attribute with namespace '%s' is not allowed\n",
                        val, NULL);
        }
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (val != NULL) &&
            (val[0] == 0) && (xmlStrEqual(ret->name, BAD_CAST "xmlns"))) {
	    xmlRngPErr(ctxt, node, XML_RNGP_XMLNS_NAME,
                       "Attribute with QName 'xmlns' is not allowed\n",
                       val, NULL);
        }
    } else if (IS_RELAXNG(node, "anyName")) {
        ret->name = NULL;
        ret->ns = NULL;
        if (node->children != NULL) {
            ret->nameClass =
                xmlRelaxNGParseExceptNameClass(ctxt, node->children,
                                               (def->type ==
                                                XML_RELAXNG_ATTRIBUTE));
        }
    } else if (IS_RELAXNG(node, "nsName")) {
        ret->name = NULL;
        ret->ns = xmlGetProp(node, BAD_CAST "ns");
        if (ret->ns == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NSNAME_NO_NS,
                       "nsName has no ns attribute\n", NULL, NULL);
        }
        if ((ctxt->flags & XML_RELAXNG_IN_ATTRIBUTE) &&
            (ret->ns != NULL) &&
            (xmlStrEqual
             (ret->ns, BAD_CAST "http://www.w3.org/2000/xmlns"))) {
            xmlRngPErr(ctxt, node, XML_RNGP_XML_NS,
                       "Attribute with namespace '%s' is not allowed\n",
                       ret->ns, NULL);
        }
        if (node->children != NULL) {
            ret->nameClass =
                xmlRelaxNGParseExceptNameClass(ctxt, node->children,
                                               (def->type ==
                                                XML_RELAXNG_ATTRIBUTE));
        }
    } else if (IS_RELAXNG(node, "choice")) {
        xmlNodePtr child;
        xmlRelaxNGDefinePtr last = NULL;

        if (def->type == XML_RELAXNG_CHOICE) {
            ret = def;
        } else {
            ret = xmlRelaxNGNewDefine(ctxt, node);
            if (ret == NULL)
                return (NULL);
            ret->parent = def;
            ret->type = XML_RELAXNG_CHOICE;
        }

        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_CHOICE_EMPTY,
                       "Element choice is empty\n", NULL, NULL);
        } else {

            child = node->children;
            while (child != NULL) {
                tmp = xmlRelaxNGParseNameClass(ctxt, child, ret);
                if (tmp != NULL) {
                    if (last == NULL) {
                        last = tmp;
                    } else if (tmp != ret) {
                        last->next = tmp;
                        last = tmp;
                    }
                }
                child = child->next;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_CHOICE_CONTENT,
                   "expecting name, anyName, nsName or choice : got %s\n",
                   (node == NULL ? (const xmlChar *) "nothing" : node->name),
		   NULL);
        return (NULL);
    }
    if (ret != def) {
        if (def->nameClass == NULL) {
            def->nameClass = ret;
        } else {
            tmp = def->nameClass;
            while (tmp->next != NULL) {
                tmp = tmp->next;
            }
            tmp->next = ret;
        }
    }
    return (ret);
}